

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fiorso(voccxdef *vctx,char *fname)

{
  ushort *puVar1;
  ushort uVar2;
  mcmcxdef *ctx;
  mcmon objnum;
  undefined2 uVar3;
  ushort uVar4;
  objnum objn;
  uchar uVar5;
  uchar uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  FILE *__stream;
  size_t sVar10;
  uchar *puVar11;
  uint16_t tmp_1;
  uint16_t tmp;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  ushort newsiz;
  uchar buf [21];
  ushort local_b8;
  objnum sc;
  uchar local_a6 [78];
  char timestamp [26];
  
  ctx = vctx->voccxmem;
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  sVar10 = fread(buf,0x12,1,__stream);
  if ((sVar10 == 1) &&
     (auVar15[0] = -(buf[0] == 'T'), auVar15[1] = -(buf[1] == 'A'), auVar15[2] = -(buf[2] == 'D'),
     auVar15[3] = -(buf[3] == 'S'), auVar15[4] = -(buf[4] == '2'), auVar15[5] = -(buf[5] == ' '),
     auVar15[6] = -(buf[6] == 's'), auVar15[7] = -(buf[7] == 'a'), auVar15[8] = -(buf[8] == 'v'),
     auVar15[9] = -(buf[9] == 'e'), auVar15[10] = -(buf[10] == '/'),
     auVar15[0xb] = -(buf[0xb] == 'g'), auVar15[0xc] = -(buf[0xc] == '\n'),
     auVar15[0xd] = -(buf[0xd] == '\r'), auVar15[0xe] = -(buf[0xe] == '\x1a'),
     auVar15[0xf] = -(buf[0xf] == '\0'),
     (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf)
     == 0xffff)) {
    uVar13 = (ulong)(ushort)buf._16_2_;
    iVar8 = 1;
  }
  else {
    uVar13 = 0;
    iVar8 = 0;
  }
  fseek(__stream,uVar13,iVar8);
  sVar10 = fread(buf,0x15,1,__stream);
  iVar8 = 2;
  if ((sVar10 == 1) && (iVar7 = bcmp(buf,"TADS2 save\n\r\x1a",0xe), iVar7 == 0)) {
    iVar7 = bcmp(buf + 0xe,"v2.2.1",7);
    if ((iVar7 == 0) || (iVar8 = bcmp(buf + 0xe,"v2.2.0",7), iVar8 == 0)) {
      sVar10 = fread(timestamp,0x1a,1,__stream);
      iVar8 = 4;
      if ((sVar10 == 1) && (iVar9 = bcmp(timestamp,vctx->voccxtim,0x1a), iVar9 == 0)) {
        vocrevert(vctx);
        iVar8 = 5;
        while (sVar10 = fread(buf,7,1,__stream), uVar6 = buf[2], uVar5 = buf[1], sVar10 == 1) {
          objnum = CONCAT11(buf[2],buf[1]);
          if (objnum == 0xffff) {
            iVar9 = fiorfda((osfildef *)__stream,vctx->voccxdmn,vctx->voccxdmc);
            if (((iVar9 == 0) &&
                (iVar9 = fiorfda((osfildef *)__stream,vctx->voccxfus,vctx->voccxfuc), iVar9 == 0))
               && (iVar9 = fiorfda((osfildef *)__stream,vctx->voccxalm,vctx->voccxalc), iVar9 == 0))
            goto LAB_00128d79;
            break;
          }
          if (buf[0] == '\x01') {
            uVar2 = CONCAT11(buf[4],buf[3]);
            puVar11 = mcmalo0(ctx,uVar2,(mcmon *)0x0,objnum,0);
            sVar10 = fread(puVar11,(ulong)uVar2,1,__stream);
            if (sVar10 != 1) break;
            if (*(ushort *)(puVar11 + 4) != 0) {
              sc = *(objnum *)(puVar11 + 0xe);
            }
            vociadd(vctx,objnum,0xffff,(uint)*(ushort *)(puVar11 + 4),&sc,0x12);
            bVar14 = true;
          }
          else {
            uVar3 = CONCAT11(buf[4],buf[3]);
            uVar4 = CONCAT11(buf[6],buf[5]);
            puVar11 = mcmlck(ctx,objnum);
            uVar2 = *(ushort *)(puVar11 + 0xc);
            uVar12 = (uint)ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[uVar6][uVar5] >> 8]
                           [(byte)ctx->mcmcxmtb[uVar6][uVar5]].mcmosiz - (uint)uVar2;
            if (uVar12 < uVar4) {
              newsiz = uVar4 - (short)uVar12;
              puVar11 = objexp(ctx,objnum,&newsiz);
              uVar2 = *(ushort *)(puVar11 + 0xc);
            }
            *(undefined2 *)(puVar11 + 6) = uVar3;
            *(ushort *)(puVar11 + 8) = uVar2 + uVar4;
            sVar10 = fread(puVar11 + uVar2,(ulong)uVar4,1,__stream);
            bVar14 = sVar10 == 1;
            objsetign(ctx,objnum);
          }
          puVar1 = &ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[uVar6][uVar5] >> 8]
                    [(byte)ctx->mcmcxmtb[uVar6][uVar5]].mcmoflg;
          *puVar1 = *puVar1 | 1;
          mcmunlck(ctx,objnum);
          if (!bVar14) break;
        }
      }
    }
    else {
      iVar8 = 3;
    }
  }
  goto LAB_001289dd;
LAB_00128d79:
  sVar10 = fread(buf,8,1,__stream);
  uVar6 = buf[1];
  uVar5 = buf[0];
  if (sVar10 == 1) {
    objn = CONCAT11(buf[7],buf[6]);
    if (objn == 0xffff) {
      if (iVar7 == 0) {
        sVar10 = fread(buf,2,1,__stream);
        if (sVar10 != 1) goto LAB_001289dd;
        vctx->voccxme = CONCAT11(buf[1],buf[0]);
      }
      iVar8 = 0;
      goto LAB_001289dd;
    }
    uVar2 = CONCAT11(buf[3],buf[2]);
    uVar13 = (ulong)uVar2;
    uVar4 = CONCAT11(buf[5],buf[4]);
    sVar10 = fread(local_a6,uVar13,1,__stream);
    if (sVar10 != 1) goto LAB_001289dd;
    if ((ulong)uVar4 == 0) {
      sc = uVar2 + 2;
    }
    else {
      local_a6[uVar13] = ' ';
      sVar10 = fread(local_a6 + uVar13 + 1,(ulong)uVar4,1,__stream);
      if (sVar10 != 1) goto LAB_001289dd;
      sc = uVar4 + uVar2 + 3;
    }
    local_b8 = (ushort)uVar5;
    if ((uVar6 & 8) == 0) {
      vocadd2(vctx,local_b8,objn,(uint)uVar6,local_a6,(uint)uVar2,local_a6 + (uVar13 - 2),
              (uint)uVar4);
    }
    else {
      vocdel1(vctx,objn,(char *)&sc,local_b8,0,0,0);
    }
    goto LAB_00128d79;
  }
LAB_001289dd:
  fclose(__stream);
  return iVar8;
}

Assistant:

int fiorso(voccxdef *vctx, char *fname)
{
    osfildef   *fp;
    objnum      obj;
    uchar      *p;
    uchar      *mut;
    uint        mutsiz;
    uint        oldmutsiz;
    int         propcnt;
    mcmcxdef   *mctx = vctx->voccxmem;
    uchar       buf[sizeof(FIOSAVHDR) + sizeof(FIOSAVVSN)];
    ushort      newsiz;
    int         err = FALSE;
    char        timestamp[26];
    int         version = 0;            /* version ID - 0 = current version */
    int         result;

    /* presume success */
    result = FIORSO_SUCCESS;

    /* open the input file */
    if (!(fp = osfoprb(fname, OSFTSAVE)))
        return FIORSO_FILE_NOT_FOUND;

    /* check for a prefix header - if it's there, skip it */
    if (!osfrb(fp, buf, (int)(sizeof(FIOSAVHDR_PREFIX) + 2))
        && memcmp(buf, FIOSAVHDR_PREFIX, sizeof(FIOSAVHDR_PREFIX)) == 0)
    {
        ulong skip_len;
        
        /*
         *   The prefix header is present - skip it.  The 2-byte value
         *   following the header is the length of the prefix data block
         *   (not including the header), so simply skip the additional
         *   number of bytes specified.  
         */
        skip_len = (ulong)osrp2(buf + sizeof(FIOSAVHDR_PREFIX));
        osfseek(fp, skip_len, OSFSK_CUR);
    }
    else
    {
        /* 
         *   there's no prefix header - seek back to the start of the file
         *   and read the standard header information
         */
        osfseek(fp, 0, OSFSK_SET);
    }

    
    /* read headers and check */
    if (osfrb(fp, buf, (int)(sizeof(FIOSAVHDR) + sizeof(FIOSAVVSN)))
        || memcmp(buf, FIOSAVHDR, (size_t)sizeof(FIOSAVHDR)))
    {
        /* it's not a saved game file */
        result = FIORSO_NOT_SAVE_FILE;
        goto ret_error;
    }

    /* check the version string */
    if (memcmp(buf + sizeof(FIOSAVHDR), FIOSAVVSN,
               (size_t)sizeof(FIOSAVVSN)) == 0)
    {
        /* it's the current version */
        version = 0;
    }
    else if (memcmp(buf + sizeof(FIOSAVHDR), FIOSAVVSN1,
                    (size_t)sizeof(FIOSAVVSN1)) == 0)
    {
        /* it's old version #1 */
        version = 1;
    }
    else
    {
        /* 
         *   this isn't a recognized version - the file must have been
         *   saved by a newer version of the system, so we can't assume we
         *   will be able to parse the format 
         */
        result = FIORSO_BAD_FMT_VSN;
        goto ret_error;
    }
    
    /* 
     *   Read timestamp and check - the game must have been saved by the
     *   same .GAM file that we are now running, because the .SAV file is
     *   written entirely in terms of the contents of the .GAM file; any
     *   change in the .GAM file invalidates the .SAV file. 
     */
    if (osfrb(fp, timestamp, 26)
        || memcmp(timestamp, vctx->voccxtim, (size_t)26))
    {
        result = FIORSO_BAD_GAME_VSN;
        goto ret_error;
    }
    
    /* first revert every object to original (post-compilation) state */
    vocrevert(vctx);

    /* 
     *   the most common error from here on is simply a file read error,
     *   so presume that this is what will happen; if we are successful or
     *   encounter a different error, we'll change the status at that
     *   point 
     */
    result = FIORSO_READ_ERROR;

    /* go through file and load changed objects */
    for (;;)
    {
        /* get the header */
        if (osfrb(fp, buf, 7))
            goto ret_error;

        /* get the object number from the header, and stop if we're done */
        obj = osrp2(buf+1);
        if (obj == MCMONINV)
            break;

        /* if the object was dynamically allocated, recreate it */
        if (buf[0] == 1)
        {
            int     sccnt;
            objnum  sc;
            
            /* create the object */
            mutsiz = osrp2(buf + 3);
            p = mcmalonum(mctx, (ushort)mutsiz, (mcmon)obj);

            /* read the object's contents */
            if (osfrb(fp, p, mutsiz))
                goto ret_error;

            /* get the superclass data (at most one superclass) */
            sccnt = objnsc(p);
            if (sccnt) sc = osrp2(objsc(p));

            /* create inheritance records for the object */
            vociadd(vctx, obj, MCMONINV, sccnt, &sc, VOCIFNEW | VOCIFVOC);

#if 0
            {
                int     wrdcnt;

                /* read the object's vocabulary and add it back */
                if (osfrb(fp, buf, 2))
                    goto ret_error;
                wrdcnt = osrp2(buf);
                while (wrdcnt--)
                {
                    int   len1;
                    int   len2;
                    char  wrd[80];
                    
                    /* read the header */
                    if (osfrb(fp, buf, 6))
                        goto ret_error;
                    len1 = osrp2(buf+2);
                    len2 = osrp2(buf+4);
                    
                    /* read the word text */
                    if (osfrb(fp, wrd, len1 + len2))
                        goto ret_error;
                    
                    /* add the word */
                    vocadd2(vctx, buf[0], obj, buf[1], wrd, len1,
                            wrd + len1, len2);
                }
            }
#endif

        }
        else
        {
            /* get the remaining data from the header */
            propcnt = osrp2(buf + 3);
            mutsiz = osrp2(buf + 5);
        
            /* expand object if it's not big enough for mutsiz */
            p = mcmlck(mctx, (mcmon)obj);
            oldmutsiz = mcmobjsiz(mctx, (mcmon)obj) - objrst(p);
            if (oldmutsiz < mutsiz)
            {
                newsiz = mutsiz - oldmutsiz;
                p = (uchar *)objexp(mctx, obj, &newsiz);
            }
            
            /* reset statistics, and read mutable part from file */
            mut = p + objrst(p);
            objsnp(p, propcnt);
            objsfree(p, mutsiz + objrst(p));
            if (osfrb(fp, mut, mutsiz))
                err = TRUE;
        
            /* reset ignore flags as needed */
            objsetign(mctx, obj);
        }

        /* touch and unlock the object */
        mcmtch(mctx, (mcmon)obj);
        mcmunlck(mctx, (mcmon)obj);
        if (err)
            goto ret_error;
    }
    
    /* read fuses/daemons/alarms */
    if (fiorfda(fp, vctx->voccxdmn, vctx->voccxdmc)
        || fiorfda(fp, vctx->voccxfus, vctx->voccxfuc)
        || fiorfda(fp, vctx->voccxalm, vctx->voccxalc))
        goto ret_error;

    /* read the dynamically added and deleted vocabulary */
    for (;;)
    {
        int     len1;
        int     len2;
        char    wrd[80];
        int     flags;
        int     typ;
        
        /* read the header */
        if (osfrb(fp, buf, 8))
            goto ret_error;

        typ = buf[0];
        flags = buf[1];
        len1 = osrp2(buf+2);
        len2 = osrp2(buf+4);
        obj = osrp2(buf+6);

        /* check to see if this is the end marker */
        if (obj == MCMONINV) break;
        
        /* read the word text */
        if (osfrb(fp, wrd+2, len1))
            goto ret_error;
        if (len2)
        {
            wrd[len1 + 2] = ' ';
            if (osfrb(fp, &wrd[len1 + 3], len2))
                goto ret_error;
            oswp2(wrd, len1 + len2 + 3);
        }
        else
            oswp2(wrd, len1 + 2);
        
        /* add or delete the word as appropriate */
        if (flags & VOCFDEL)
            vocdel1(vctx, obj, (char *)wrd, (prpnum)typ, FALSE, FALSE, FALSE);
        else
            vocadd2(vctx, buf[0], obj, buf[1], (uchar *)wrd+2, len1,
                    (uchar *)wrd+len1, len2);
    }

    /* 
     *   the following was added in save format version "v2.2.1", so skip
     *   it if the save version is older than that 
     */
    if (version != 1)
    {
        /* read the current "Me" object */
        if (osfrb(fp, buf, 2))
            goto ret_error;
        vctx->voccxme = osrp2(buf);
    }

    /* done - close file and return success indication */
    osfcls(fp);
    return FIORSO_SUCCESS;

    /* come here on failure - close file and return error indication */
ret_error:
    osfcls(fp);
    return result;
}